

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O2

aom_codec_err_t
aom_read_obu_header(uint8_t *buffer,size_t buffer_length,size_t *consumed,ObuHeader *header,
                   int is_annexb)

{
  aom_codec_err_t aVar1;
  aom_read_bit_buffer local_38;
  
  if (header == (ObuHeader *)0x0 || (consumed == (size_t *)0x0 || buffer_length == 0)) {
    aVar1 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    local_38.bit_buffer_end = buffer + buffer_length;
    local_38.bit_offset = 0;
    local_38.error_handler_data = (void *)0x0;
    local_38.error_handler = (aom_rb_error_handler)0x0;
    local_38.bit_buffer = buffer;
    aVar1 = read_obu_header(&local_38,is_annexb,header);
    if (aVar1 == AOM_CODEC_OK) {
      *consumed = header->size;
    }
  }
  return aVar1;
}

Assistant:

aom_codec_err_t aom_read_obu_header(uint8_t *buffer, size_t buffer_length,
                                    size_t *consumed, ObuHeader *header,
                                    int is_annexb) {
  if (buffer_length < 1 || !consumed || !header) return AOM_CODEC_INVALID_PARAM;

  // TODO(tomfinegan): Set the error handler here and throughout this file, and
  // confirm parsing work done via aom_read_bit_buffer is successful.
  struct aom_read_bit_buffer rb = { buffer, buffer + buffer_length, 0, NULL,
                                    NULL };
  aom_codec_err_t parse_result = read_obu_header(&rb, is_annexb, header);
  if (parse_result == AOM_CODEC_OK) *consumed = header->size;
  return parse_result;
}